

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

int __thiscall
lzham::adaptive_arith_data_model::init(adaptive_arith_data_model *this,EVP_PKEY_CTX *ctx)

{
  adaptive_bit_model *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  uint uVar11;
  uint in_EDX;
  long lVar12;
  undefined8 unaff_RBP;
  undefined7 uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar17;
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  int iVar37;
  undefined1 auVar36 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar40 [16];
  
  uVar13 = (undefined7)((ulong)unaff_RBP >> 8);
  if (in_EDX != 1) {
    if (in_EDX == 0) {
      this->m_total_syms = 0;
      paVar1 = (this->m_probs).m_p;
      iVar29 = (int)CONCAT71(uVar13,1);
      if (paVar1 == (adaptive_bit_model *)0x0) {
        return iVar29;
      }
      lzham_free(paVar1);
      (this->m_probs).m_p = (adaptive_bit_model *)0x0;
      (this->m_probs).m_size = 0;
      (this->m_probs).m_capacity = 0;
      return iVar29;
    }
    if ((in_EDX & in_EDX - 1) == 0) goto LAB_0011ddf1;
  }
  uVar11 = in_EDX - 1 >> 0x10 | in_EDX - 1;
  uVar11 = uVar11 >> 8 | uVar11;
  uVar11 = uVar11 >> 4 | uVar11;
  uVar11 = uVar11 >> 2 | uVar11;
  in_EDX = (uVar11 >> 1 | uVar11) + 1;
LAB_0011ddf1:
  this->m_total_syms = in_EDX;
  uVar11 = (this->m_probs).m_size;
  if (uVar11 != in_EDX) {
    if (uVar11 <= in_EDX) {
      if ((this->m_probs).m_capacity < in_EDX) {
        bVar10 = elemental_vector::increase_capacity
                           ((elemental_vector *)&this->m_probs,in_EDX,uVar11 + 1 == in_EDX,2,
                            vector<lzham::adaptive_bit_model>::object_mover,true);
        if (!bVar10) {
          return 0;
        }
        uVar11 = (this->m_probs).m_size;
      }
      auVar9 = _DAT_00122f00;
      auVar8 = _DAT_00122ef0;
      auVar7 = _DAT_00122390;
      auVar6 = _DAT_00122380;
      auVar5 = _DAT_00122370;
      if (uVar11 != in_EDX) {
        paVar1 = (this->m_probs).m_p;
        uVar14 = (ulong)(in_EDX - uVar11) + 0x7fffffffffffffff;
        uVar15 = uVar14 & 0x7fffffffffffffff;
        auVar16._8_4_ = (int)uVar15;
        auVar16._0_8_ = uVar15;
        auVar16._12_4_ = (int)(uVar15 >> 0x20);
        lVar12 = 0;
        auVar16 = auVar16 ^ _DAT_00122390;
        do {
          auVar28._8_4_ = (int)lVar12;
          auVar28._0_8_ = lVar12;
          auVar28._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar20 = (auVar28 | auVar6) ^ auVar7;
          iVar29 = auVar16._0_4_;
          iVar35 = -(uint)(iVar29 < auVar20._0_4_);
          iVar17 = auVar16._4_4_;
          auVar21._4_4_ = -(uint)(iVar17 < auVar20._4_4_);
          iVar34 = auVar16._8_4_;
          iVar37 = -(uint)(iVar34 < auVar20._8_4_);
          iVar18 = auVar16._12_4_;
          auVar21._12_4_ = -(uint)(iVar18 < auVar20._12_4_);
          auVar31._4_4_ = iVar35;
          auVar31._0_4_ = iVar35;
          auVar31._8_4_ = iVar37;
          auVar31._12_4_ = iVar37;
          auVar38 = pshuflw(in_XMM11,auVar31,0xe8);
          auVar23._4_4_ = -(uint)(auVar20._4_4_ == iVar17);
          auVar23._12_4_ = -(uint)(auVar20._12_4_ == iVar18);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar40 = pshuflw(in_XMM12,auVar23,0xe8);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar39 = pshuflw(auVar38,auVar21,0xe8);
          auVar20._8_4_ = 0xffffffff;
          auVar20._0_8_ = 0xffffffffffffffff;
          auVar20._12_4_ = 0xffffffff;
          auVar20 = (auVar39 | auVar40 & auVar38) ^ auVar20;
          auVar20 = packssdw(auVar20,auVar20);
          if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            paVar1[(ulong)uVar11 + lVar12].m_bit_0_prob = 0x400;
          }
          auVar21 = auVar23 & auVar31 | auVar21;
          auVar20 = packssdw(auVar21,auVar21);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 ^ auVar39,auVar20 ^ auVar39);
          if ((auVar20._0_4_ >> 0x10 & 1) != 0) {
            paVar1[(ulong)uVar11 + lVar12 + 1].m_bit_0_prob = 0x400;
          }
          auVar20 = (auVar28 | auVar5) ^ auVar7;
          iVar35 = -(uint)(iVar29 < auVar20._0_4_);
          auVar36._4_4_ = -(uint)(iVar17 < auVar20._4_4_);
          iVar37 = -(uint)(iVar34 < auVar20._8_4_);
          auVar36._12_4_ = -(uint)(iVar18 < auVar20._12_4_);
          auVar22._4_4_ = iVar35;
          auVar22._0_4_ = iVar35;
          auVar22._8_4_ = iVar37;
          auVar22._12_4_ = iVar37;
          auVar30._4_4_ = -(uint)(auVar20._4_4_ == iVar17);
          auVar30._12_4_ = -(uint)(auVar20._12_4_ == iVar18);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar20 = auVar30 & auVar22 | auVar36;
          auVar20 = packssdw(auVar20,auVar20);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 ^ auVar2,auVar20 ^ auVar2);
          if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            paVar1[(ulong)uVar11 + lVar12 + 2].m_bit_0_prob = 0x400;
          }
          auVar23 = pshufhw(auVar22,auVar22,0x84);
          auVar31 = pshufhw(auVar30,auVar30,0x84);
          auVar21 = pshufhw(auVar23,auVar36,0x84);
          auVar24._8_4_ = 0xffffffff;
          auVar24._0_8_ = 0xffffffffffffffff;
          auVar24._12_4_ = 0xffffffff;
          auVar24 = (auVar21 | auVar31 & auVar23) ^ auVar24;
          auVar23 = packssdw(auVar24,auVar24);
          if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            paVar1[(ulong)uVar11 + lVar12 + 3].m_bit_0_prob = 0x400;
          }
          auVar23 = (auVar28 | auVar9) ^ auVar7;
          iVar35 = -(uint)(iVar29 < auVar23._0_4_);
          auVar26._4_4_ = -(uint)(iVar17 < auVar23._4_4_);
          iVar37 = -(uint)(iVar34 < auVar23._8_4_);
          auVar26._12_4_ = -(uint)(iVar18 < auVar23._12_4_);
          auVar32._4_4_ = iVar35;
          auVar32._0_4_ = iVar35;
          auVar32._8_4_ = iVar37;
          auVar32._12_4_ = iVar37;
          auVar20 = pshuflw(auVar20,auVar32,0xe8);
          auVar25._4_4_ = -(uint)(auVar23._4_4_ == iVar17);
          auVar25._12_4_ = -(uint)(auVar23._12_4_ == iVar18);
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar23 = pshuflw(auVar40 & auVar38,auVar25,0xe8);
          in_XMM12 = auVar23 & auVar20;
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          auVar20 = pshuflw(auVar20,auVar26,0xe8);
          auVar38._8_4_ = 0xffffffff;
          auVar38._0_8_ = 0xffffffffffffffff;
          auVar38._12_4_ = 0xffffffff;
          auVar38 = (auVar20 | in_XMM12) ^ auVar38;
          in_XMM11 = packssdw(auVar38,auVar38);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            paVar1[(ulong)uVar11 + lVar12 + 4].m_bit_0_prob = 0x400;
          }
          auVar26 = auVar25 & auVar32 | auVar26;
          auVar20 = packssdw(auVar26,auVar26);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 ^ auVar40,auVar20 ^ auVar40);
          if ((auVar20 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            paVar1[(ulong)uVar11 + lVar12 + 5].m_bit_0_prob = 0x400;
          }
          auVar20 = (auVar28 | auVar8) ^ auVar7;
          iVar29 = -(uint)(iVar29 < auVar20._0_4_);
          auVar33._4_4_ = -(uint)(iVar17 < auVar20._4_4_);
          iVar34 = -(uint)(iVar34 < auVar20._8_4_);
          auVar33._12_4_ = -(uint)(iVar18 < auVar20._12_4_);
          auVar27._4_4_ = iVar29;
          auVar27._0_4_ = iVar29;
          auVar27._8_4_ = iVar34;
          auVar27._12_4_ = iVar34;
          auVar19._4_4_ = -(uint)(auVar20._4_4_ == iVar17);
          auVar19._12_4_ = -(uint)(auVar20._12_4_ == iVar18);
          auVar19._0_4_ = auVar19._4_4_;
          auVar19._8_4_ = auVar19._12_4_;
          auVar33._0_4_ = auVar33._4_4_;
          auVar33._8_4_ = auVar33._12_4_;
          auVar20 = auVar19 & auVar27 | auVar33;
          auVar20 = packssdw(auVar20,auVar20);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 ^ auVar3,auVar20 ^ auVar3);
          if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            paVar1[(ulong)uVar11 + lVar12 + 6].m_bit_0_prob = 0x400;
          }
          auVar28 = pshufhw(auVar27,auVar27,0x84);
          auVar20 = pshufhw(auVar19,auVar19,0x84);
          auVar23 = pshufhw(auVar28,auVar33,0x84);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 & auVar28,(auVar23 | auVar20 & auVar28) ^ auVar4);
          if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            paVar1[(ulong)uVar11 + lVar12 + 7].m_bit_0_prob = 0x400;
          }
          lVar12 = lVar12 + 8;
        } while ((uVar15 - ((uint)uVar14 & 7)) + 8 != lVar12);
      }
    }
    (this->m_probs).m_size = in_EDX;
  }
  return (int)CONCAT71(uVar13,1);
}

Assistant:

bool adaptive_arith_data_model::init(bool encoding, uint total_syms)
   {
      encoding;
      if (!total_syms)
      {
         clear();
         return true;
      }

      if ((total_syms < 2) || (!math::is_power_of_2(total_syms)))
         total_syms = math::next_pow2(total_syms);

      m_total_syms = total_syms;

      if (!m_probs.try_resize(m_total_syms))
         return false;

      return true;
   }